

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Sigmoid_x86_avx2::forward_inplace(Sigmoid_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar26 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar18 [16];
  undefined1 auVar24 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar29 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_02 [60];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar77 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 local_128 [16];
  float local_e8;
  undefined1 auVar25 [32];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  uVar12 = bottom_top_blob->c;
  uVar14 = (ulong)uVar12;
  uVar13 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar12) {
      uVar9 = 0;
      auVar55 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                   CONCAT424(0x42b0c0a5,
                                             CONCAT420(0x42b0c0a5,
                                                       CONCAT416(0x42b0c0a5,
                                                                 CONCAT412(0x42b0c0a5,
                                                                           CONCAT48(0x42b0c0a5,
                                                                                                                                                                        
                                                  0x42b0c0a542b0c0a5)))))));
      auVar58._8_4_ = 0xc2b0c0a5;
      auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar58._12_4_ = 0xc2b0c0a5;
      auVar58._16_4_ = 0xc2b0c0a5;
      auVar58._20_4_ = 0xc2b0c0a5;
      auVar58._24_4_ = 0xc2b0c0a5;
      auVar58._28_4_ = 0xc2b0c0a5;
      auVar79 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                   CONCAT424(0x3fb8aa3b,
                                             CONCAT420(0x3fb8aa3b,
                                                       CONCAT416(0x3fb8aa3b,
                                                                 CONCAT412(0x3fb8aa3b,
                                                                           CONCAT48(0x3fb8aa3b,
                                                                                                                                                                        
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar44 = ZEXT3264(CONCAT428(0x3f000000,
                                   CONCAT424(0x3f000000,
                                             CONCAT420(0x3f000000,
                                                       CONCAT416(0x3f000000,
                                                                 CONCAT412(0x3f000000,
                                                                           CONCAT48(0x3f000000,
                                                                                                                                                                        
                                                  0x3f0000003f000000)))))));
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar35._16_4_ = 0x3f800000;
      auVar35._20_4_ = 0x3f800000;
      auVar35._24_4_ = 0x3f800000;
      auVar35._28_4_ = 0x3f800000;
      auVar41 = ZEXT3264(CONCAT428(0xbf317218,
                                   CONCAT424(0xbf317218,
                                             CONCAT420(0xbf317218,
                                                       CONCAT416(0xbf317218,
                                                                 CONCAT412(0xbf317218,
                                                                           CONCAT48(0xbf317218,
                                                                                                                                                                        
                                                  0xbf317218bf317218)))))));
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20._16_4_ = 0x3f800000;
      auVar20._20_4_ = 0x3f800000;
      auVar20._24_4_ = 0x3f800000;
      auVar20._28_4_ = 0x3f800000;
      do {
        auVar62._8_4_ = 0x39506967;
        auVar62._0_8_ = 0x3950696739506967;
        auVar62._12_4_ = 0x39506967;
        auVar62._16_4_ = 0x39506967;
        auVar62._20_4_ = 0x39506967;
        auVar62._24_4_ = 0x39506967;
        auVar62._28_4_ = 0x39506967;
        auVar66._8_4_ = 0x3c088908;
        auVar66._0_8_ = 0x3c0889083c088908;
        auVar66._12_4_ = 0x3c088908;
        auVar66._16_4_ = 0x3c088908;
        auVar66._20_4_ = 0x3c088908;
        auVar66._24_4_ = 0x3c088908;
        auVar66._28_4_ = 0x3c088908;
        auVar69._8_4_ = 0x3d2aa9c1;
        auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar69._12_4_ = 0x3d2aa9c1;
        auVar69._16_4_ = 0x3d2aa9c1;
        auVar69._20_4_ = 0x3d2aa9c1;
        auVar69._24_4_ = 0x3d2aa9c1;
        auVar69._28_4_ = 0x3d2aa9c1;
        auVar24._8_4_ = 0x3e2aaaaa;
        auVar24._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar24._12_4_ = 0x3e2aaaaa;
        auVar24._16_4_ = 0x3e2aaaaa;
        auVar24._20_4_ = 0x3e2aaaaa;
        auVar24._24_4_ = 0x3e2aaaaa;
        auVar24._28_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar13) {
          pauVar15 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar12 = uVar13;
          do {
            auVar53._0_8_ = *(ulong *)*pauVar15 ^ 0x8000000080000000;
            auVar53._8_4_ = *(uint *)((long)*pauVar15 + 8) ^ 0x80000000;
            auVar53._12_4_ = *(uint *)((long)*pauVar15 + 0xc) ^ 0x80000000;
            auVar53._16_4_ = *(uint *)((long)*pauVar15 + 0x10) ^ 0x80000000;
            auVar53._20_4_ = *(uint *)((long)*pauVar15 + 0x14) ^ 0x80000000;
            auVar53._24_4_ = *(uint *)((long)*pauVar15 + 0x18) ^ 0x80000000;
            auVar53._28_4_ = *(uint *)((long)*pauVar15 + 0x1c) ^ 0x80000000;
            auVar53 = vminps_avx(auVar53,auVar55._0_32_);
            auVar1 = vmaxps_avx(auVar53,auVar58);
            auVar43 = auVar44._0_32_;
            auVar51 = vfmadd213ps_fma(auVar79._0_32_,auVar1,auVar43);
            auVar52 = vroundps_avx(ZEXT1632(auVar51),1);
            auVar53 = vcmpps_avx(ZEXT1632(auVar51),auVar52,1);
            auVar53 = vandps_avx(auVar53,auVar35);
            auVar53 = vsubps_avx(auVar52,auVar53);
            auVar57 = vfmadd231ps_fma(auVar1,auVar53,auVar41._0_32_);
            auVar46 = ZEXT1632(auVar57);
            fVar2 = auVar57._0_4_;
            fVar3 = auVar57._4_4_;
            fVar4 = auVar57._8_4_;
            fVar5 = auVar57._12_4_;
            auVar1._28_4_ = auVar52._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(fVar5 * fVar5,
                                    CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
            auVar63._8_4_ = 0x3ab743ce;
            auVar63._0_8_ = 0x3ab743ce3ab743ce;
            auVar63._12_4_ = 0x3ab743ce;
            auVar63._16_4_ = 0x3ab743ce;
            auVar63._20_4_ = 0x3ab743ce;
            auVar63._24_4_ = 0x3ab743ce;
            auVar63._28_4_ = 0x3ab743ce;
            auVar51 = vfmadd213ps_fma(auVar62,auVar46,auVar63);
            auVar44 = ZEXT3264(auVar43);
            auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar46,auVar66);
            auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar46,auVar69);
            auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar57),auVar24);
            auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar57),auVar43);
            auVar43._0_4_ = fVar2 + 1.0;
            auVar43._4_4_ = fVar3 + 1.0;
            auVar43._8_4_ = fVar4 + 1.0;
            auVar43._12_4_ = fVar5 + 1.0;
            auVar43._16_4_ = 0x3f800000;
            auVar43._20_4_ = 0x3f800000;
            auVar43._24_4_ = 0x3f800000;
            auVar43._28_4_ = 0x3f800000;
            auVar51 = vfmadd231ps_fma(auVar43,auVar1,ZEXT1632(auVar51));
            auVar52._0_4_ = (int)auVar53._0_4_;
            auVar52._4_4_ = (int)auVar53._4_4_;
            auVar52._8_4_ = (int)auVar53._8_4_;
            auVar52._12_4_ = (int)auVar53._12_4_;
            auVar52._16_4_ = (int)auVar53._16_4_;
            auVar52._20_4_ = (int)auVar53._20_4_;
            auVar52._24_4_ = (int)auVar53._24_4_;
            auVar52._28_4_ = (int)auVar53._28_4_;
            auVar79 = ZEXT3264(auVar79._0_32_);
            auVar53 = vpslld_avx2(auVar52,0x17);
            auVar53 = vpaddd_avx2(auVar53,auVar20);
            auVar51 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar51),auVar35);
            auVar53 = vrcpps_avx(ZEXT1632(auVar51));
            auVar51 = vfmsub213ps_fma(ZEXT1632(auVar51),auVar53,auVar35);
            auVar51 = vfnmadd132ps_fma(ZEXT1632(auVar51),auVar53,auVar53);
            *pauVar15 = ZEXT1632(auVar51);
            auVar55 = ZEXT3264(auVar55._0_32_);
            auVar41 = ZEXT3264(CONCAT428(0xbf317218,
                                         CONCAT424(0xbf317218,
                                                   CONCAT420(0xbf317218,
                                                             CONCAT416(0xbf317218,
                                                                       CONCAT412(0xbf317218,
                                                                                 CONCAT48(0xbf317218
                                                                                          ,
                                                  0xbf317218bf317218)))))));
            pauVar15 = pauVar15 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar14);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar12) {
      uVar9 = 0;
      auVar55 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar56._8_4_ = 0xc2b0c0a5;
      auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar56._12_4_ = 0xc2b0c0a5;
      auVar79 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar44 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar41 = ZEXT1664(CONCAT412(0xbf317218,CONCAT48(0xbf317218,0xbf317218bf317218)));
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      do {
        auVar60._8_4_ = 0x39506967;
        auVar60._0_8_ = 0x3950696739506967;
        auVar60._12_4_ = 0x39506967;
        auVar65._8_4_ = 0x3c088908;
        auVar65._0_8_ = 0x3c0889083c088908;
        auVar65._12_4_ = 0x3c088908;
        auVar68._8_4_ = 0x3d2aa9c1;
        auVar68._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar68._12_4_ = 0x3d2aa9c1;
        auVar30._8_4_ = 0x3e2aaaaa;
        auVar30._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar30._12_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar13) {
          pauVar11 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar12 = uVar13;
          do {
            auVar73._0_8_ = *(ulong *)*pauVar11 ^ 0x8000000080000000;
            auVar73._8_4_ = *(uint *)(*pauVar11 + 8) ^ 0x80000000;
            auVar73._12_4_ = *(uint *)(*pauVar11 + 0xc) ^ 0x80000000;
            auVar51 = vminps_avx(auVar73,auVar55._0_16_);
            auVar29 = vmaxps_avx(auVar51,auVar56);
            auVar42 = auVar44._0_16_;
            auVar51 = vfmadd213ps_fma(auVar79._0_16_,auVar29,auVar42);
            auVar80._0_4_ = (int)auVar51._0_4_;
            auVar80._4_4_ = (int)auVar51._4_4_;
            auVar80._8_4_ = (int)auVar51._8_4_;
            auVar80._12_4_ = (int)auVar51._12_4_;
            auVar57 = vcvtdq2ps_avx(auVar80);
            auVar51 = vcmpps_avx(auVar51,auVar57,1);
            auVar51 = vandps_avx(auVar51,auVar36);
            auVar51 = vsubps_avx(auVar57,auVar51);
            auVar29 = vfmadd231ps_fma(auVar29,auVar51,auVar41._0_16_);
            fVar2 = auVar29._0_4_;
            auVar81._0_4_ = fVar2 * fVar2;
            fVar3 = auVar29._4_4_;
            auVar81._4_4_ = fVar3 * fVar3;
            fVar4 = auVar29._8_4_;
            auVar81._8_4_ = fVar4 * fVar4;
            fVar5 = auVar29._12_4_;
            auVar81._12_4_ = fVar5 * fVar5;
            auVar61._8_4_ = 0x3ab743ce;
            auVar61._0_8_ = 0x3ab743ce3ab743ce;
            auVar61._12_4_ = 0x3ab743ce;
            auVar57 = vfmadd213ps_fma(auVar60,auVar29,auVar61);
            auVar44 = ZEXT1664(auVar42);
            auVar57 = vfmadd213ps_fma(auVar57,auVar29,auVar65);
            auVar57 = vfmadd213ps_fma(auVar57,auVar29,auVar68);
            auVar57 = vfmadd213ps_fma(auVar57,auVar29,auVar30);
            auVar57 = vfmadd213ps_fma(auVar57,auVar29,auVar42);
            auVar74._0_4_ = fVar2 + 1.0;
            auVar74._4_4_ = fVar3 + 1.0;
            auVar74._8_4_ = fVar4 + 1.0;
            auVar74._12_4_ = fVar5 + 1.0;
            auVar57 = vfmadd231ps_fma(auVar74,auVar81,auVar57);
            auVar50._0_4_ = (int)auVar51._0_4_;
            auVar50._4_4_ = (int)auVar51._4_4_;
            auVar50._8_4_ = (int)auVar51._8_4_;
            auVar50._12_4_ = (int)auVar51._12_4_;
            auVar79 = ZEXT1664(auVar79._0_16_);
            auVar51 = vpslld_avx(auVar50,0x17);
            auVar51 = vpaddd_avx(auVar51,auVar45);
            auVar57 = vfmadd213ps_fma(auVar51,auVar57,auVar36);
            auVar51 = vrcpps_avx(auVar57);
            auVar57 = vfmsub213ps_fma(auVar57,auVar51,auVar36);
            auVar51 = vfnmadd132ps_fma(auVar57,auVar51,auVar51);
            *pauVar11 = auVar51;
            auVar55 = ZEXT1664(auVar55._0_16_);
            auVar41 = ZEXT1664(CONCAT412(0xbf317218,CONCAT48(0xbf317218,0xbf317218bf317218)));
            pauVar11 = pauVar11 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar14);
    }
  }
  else if (0 < (int)uVar12) {
    uVar9 = 0;
    auVar41 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    do {
      auVar83._8_4_ = 0x3e2aaaaa;
      auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar78._8_4_ = 0x3d2aa9c1;
      auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar76._8_4_ = 0x3c088908;
      auVar76._0_8_ = 0x3c0889083c088908;
      auVar72._8_4_ = 0x3ab743ce;
      auVar72._0_8_ = 0x3ab743ce3ab743ce;
      auVar70._8_4_ = 0x39506967;
      auVar70._0_8_ = 0x3950696739506967;
      auVar67._8_4_ = 0xbf317218;
      auVar67._0_8_ = 0xbf317218bf317218;
      auVar59._8_4_ = 0x3f000000;
      auVar59._0_8_ = 0x3f0000003f000000;
      auVar54._8_4_ = 0x3fb8aa3b;
      auVar54._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar49._8_4_ = 0xc2b0c0a5;
      auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar46._8_4_ = 0x42b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar83._12_4_ = 0x3e2aaaaa;
      auVar78._12_4_ = 0x3d2aa9c1;
      auVar76._12_4_ = 0x3c088908;
      auVar72._12_4_ = 0x3ab743ce;
      auVar70._12_4_ = 0x39506967;
      auVar67._12_4_ = 0xbf317218;
      auVar59._12_4_ = 0x3f000000;
      auVar54._12_4_ = 0x3fb8aa3b;
      auVar49._12_4_ = 0xc2b0c0a5;
      auVar46._12_4_ = 0x42b0c0a5;
      auVar83._16_4_ = 0x3e2aaaaa;
      auVar78._16_4_ = 0x3d2aa9c1;
      auVar76._16_4_ = 0x3c088908;
      auVar72._16_4_ = 0x3ab743ce;
      auVar70._16_4_ = 0x39506967;
      auVar67._16_4_ = 0xbf317218;
      auVar59._16_4_ = 0x3f000000;
      auVar54._16_4_ = 0x3fb8aa3b;
      auVar49._16_4_ = 0xc2b0c0a5;
      auVar46._16_4_ = 0x42b0c0a5;
      auVar83._20_4_ = 0x3e2aaaaa;
      auVar78._20_4_ = 0x3d2aa9c1;
      auVar76._20_4_ = 0x3c088908;
      auVar72._20_4_ = 0x3ab743ce;
      auVar70._20_4_ = 0x39506967;
      auVar67._20_4_ = 0xbf317218;
      auVar59._20_4_ = 0x3f000000;
      auVar54._20_4_ = 0x3fb8aa3b;
      auVar49._20_4_ = 0xc2b0c0a5;
      auVar46._20_4_ = 0x42b0c0a5;
      auVar83._24_4_ = 0x3e2aaaaa;
      auVar78._24_4_ = 0x3d2aa9c1;
      auVar76._24_4_ = 0x3c088908;
      auVar72._24_4_ = 0x3ab743ce;
      auVar70._24_4_ = 0x39506967;
      auVar67._24_4_ = 0xbf317218;
      auVar59._24_4_ = 0x3f000000;
      auVar54._24_4_ = 0x3fb8aa3b;
      auVar49._24_4_ = 0xc2b0c0a5;
      auVar46._24_4_ = 0x42b0c0a5;
      auVar83._28_4_ = 0x3e2aaaaa;
      auVar78._28_4_ = 0x3d2aa9c1;
      auVar76._28_4_ = 0x3c088908;
      auVar72._28_4_ = 0x3ab743ce;
      auVar70._28_4_ = 0x39506967;
      auVar67._28_4_ = 0xbf317218;
      auVar59._28_4_ = 0x3f000000;
      auVar54._28_4_ = 0x3fb8aa3b;
      auVar49._28_4_ = 0xc2b0c0a5;
      auVar46._28_4_ = 0x42b0c0a5;
      pauVar15 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar13 < 8) {
        uVar12 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar19._0_8_ = *(ulong *)*pauVar15 ^ 0x8000000080000000;
          auVar19._8_4_ = *(uint *)((long)*pauVar15 + 8) ^ 0x80000000;
          auVar19._12_4_ = *(uint *)((long)*pauVar15 + 0xc) ^ 0x80000000;
          auVar19._16_4_ = *(uint *)((long)*pauVar15 + 0x10) ^ 0x80000000;
          auVar19._20_4_ = *(uint *)((long)*pauVar15 + 0x14) ^ 0x80000000;
          auVar19._24_4_ = *(uint *)((long)*pauVar15 + 0x18) ^ 0x80000000;
          auVar19._28_4_ = *(uint *)((long)*pauVar15 + 0x1c) ^ 0x80000000;
          auVar35 = vminps_avx(auVar19,auVar46);
          auVar20 = vmaxps_avx(auVar35,auVar49);
          auVar51 = vfmadd213ps_fma(auVar54,auVar20,auVar59);
          auVar58 = vroundps_avx(ZEXT1632(auVar51),1);
          auVar35 = vcmpps_avx(ZEXT1632(auVar51),auVar58,1);
          auVar24 = auVar41._0_32_;
          auVar35 = vandps_avx(auVar24,auVar35);
          auVar35 = vsubps_avx(auVar58,auVar35);
          auVar57 = vfmadd231ps_fma(auVar20,auVar35,auVar67);
          auVar20 = ZEXT1632(auVar57);
          fVar2 = auVar57._0_4_;
          fVar3 = auVar57._4_4_;
          fVar4 = auVar57._8_4_;
          fVar5 = auVar57._12_4_;
          auVar6._28_4_ = auVar58._28_4_;
          auVar6._0_28_ =
               ZEXT1628(CONCAT412(fVar5 * fVar5,
                                  CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
          auVar51 = vfmadd213ps_fma(auVar70,auVar20,auVar72);
          auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar20,auVar76);
          auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar20,auVar78);
          auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar57),auVar83);
          auVar51 = vfmadd213ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar57),auVar59);
          auVar21._0_4_ = auVar41._0_4_ + fVar2;
          auVar21._4_4_ = auVar41._4_4_ + fVar3;
          auVar21._8_4_ = auVar41._8_4_ + fVar4;
          auVar21._12_4_ = auVar41._12_4_ + fVar5;
          auVar21._16_4_ = auVar41._16_4_ + 0.0;
          auVar21._20_4_ = auVar41._20_4_ + 0.0;
          auVar21._24_4_ = auVar41._24_4_ + 0.0;
          auVar21._28_4_ = auVar41._28_4_ + 0.0;
          auVar51 = vfmadd231ps_fma(auVar21,auVar6,ZEXT1632(auVar51));
          auVar34._0_4_ = (int)auVar35._0_4_;
          auVar34._4_4_ = (int)auVar35._4_4_;
          auVar34._8_4_ = (int)auVar35._8_4_;
          auVar34._12_4_ = (int)auVar35._12_4_;
          auVar34._16_4_ = (int)auVar35._16_4_;
          auVar34._20_4_ = (int)auVar35._20_4_;
          auVar34._24_4_ = (int)auVar35._24_4_;
          auVar34._28_4_ = (int)auVar35._28_4_;
          auVar35 = vpslld_avx2(auVar34,0x17);
          auVar7._8_4_ = 0x3f800000;
          auVar7._0_8_ = 0x3f8000003f800000;
          auVar7._12_4_ = 0x3f800000;
          auVar7._16_4_ = 0x3f800000;
          auVar7._20_4_ = 0x3f800000;
          auVar7._24_4_ = 0x3f800000;
          auVar7._28_4_ = 0x3f800000;
          auVar35 = vpaddd_avx2(auVar35,auVar7);
          auVar51 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar51),auVar24);
          auVar35 = vrcpps_avx(ZEXT1632(auVar51));
          auVar51 = vfmsub213ps_fma(ZEXT1632(auVar51),auVar35,auVar24);
          auVar51 = vfnmadd132ps_fma(ZEXT1632(auVar51),auVar35,auVar35);
          *pauVar15 = ZEXT1632(auVar51);
          pauVar15 = pauVar15 + 1;
          iVar8 = iVar8 + 8;
          uVar12 = uVar13 & 0xfffffff8;
        } while (iVar8 < (int)uVar13);
      }
      auVar51._8_4_ = 0xc2b0c0a5;
      auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar51._12_4_ = 0xc2b0c0a5;
      auVar57._8_4_ = 0x3fb8aa3b;
      auVar57._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar57._12_4_ = 0x3fb8aa3b;
      auVar29._8_4_ = 0x3f000000;
      auVar29._0_8_ = 0x3f0000003f000000;
      auVar29._12_4_ = 0x3f000000;
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar71._8_4_ = 0xbf317218;
      auVar71._0_8_ = 0xbf317218bf317218;
      auVar71._12_4_ = 0xbf317218;
      auVar75._8_4_ = 0x39506967;
      auVar75._0_8_ = 0x3950696739506967;
      auVar75._12_4_ = 0x39506967;
      auVar77._8_4_ = 0x3ab743ce;
      auVar77._0_8_ = 0x3ab743ce3ab743ce;
      auVar77._12_4_ = 0x3ab743ce;
      auVar82._8_4_ = 0x3c088908;
      auVar82._0_8_ = 0x3c0889083c088908;
      auVar82._12_4_ = 0x3c088908;
      uVar10 = uVar12 | 3;
      while ((int)uVar10 < (int)uVar13) {
        auVar33._0_8_ = *(ulong *)*pauVar15 ^ 0x8000000080000000;
        auVar33._8_4_ = *(uint *)((long)*pauVar15 + 8) ^ 0x80000000;
        auVar33._12_4_ = *(uint *)((long)*pauVar15 + 0xc) ^ 0x80000000;
        auVar31._8_4_ = 0x42b0c0a5;
        auVar31._0_8_ = 0x42b0c0a542b0c0a5;
        auVar31._12_4_ = 0x42b0c0a5;
        auVar33 = vminps_avx(auVar33,auVar31);
        auVar17 = vmaxps_avx(auVar33,auVar51);
        auVar33 = vfmadd213ps_fma(auVar57,auVar17,auVar29);
        auVar37._0_4_ = (int)auVar33._0_4_;
        auVar37._4_4_ = (int)auVar33._4_4_;
        auVar37._8_4_ = (int)auVar33._8_4_;
        auVar37._12_4_ = (int)auVar33._12_4_;
        auVar31 = vcvtdq2ps_avx(auVar37);
        auVar33 = vcmpps_avx(auVar33,auVar31,1);
        auVar33 = vandps_avx(auVar42,auVar33);
        auVar33 = vsubps_avx(auVar31,auVar33);
        auVar17 = vfmadd231ps_fma(auVar17,auVar33,auVar71);
        fVar2 = auVar17._0_4_;
        auVar38._0_4_ = fVar2 * fVar2;
        fVar3 = auVar17._4_4_;
        auVar38._4_4_ = fVar3 * fVar3;
        fVar4 = auVar17._8_4_;
        auVar38._8_4_ = fVar4 * fVar4;
        fVar5 = auVar17._12_4_;
        auVar38._12_4_ = fVar5 * fVar5;
        auVar31 = vfmadd213ps_fma(auVar75,auVar17,auVar77);
        auVar31 = vfmadd213ps_fma(auVar31,auVar17,auVar82);
        auVar47._8_4_ = 0x3d2aa9c1;
        auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar47._12_4_ = 0x3d2aa9c1;
        auVar31 = vfmadd213ps_fma(auVar31,auVar17,auVar47);
        auVar48._8_4_ = 0x3e2aaaaa;
        auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar48._12_4_ = 0x3e2aaaaa;
        auVar31 = vfmadd213ps_fma(auVar31,auVar17,auVar48);
        auVar31 = vfmadd213ps_fma(auVar31,auVar17,auVar29);
        auVar17._0_4_ = fVar2 + 1.0;
        auVar17._4_4_ = fVar3 + 1.0;
        auVar17._8_4_ = fVar4 + 1.0;
        auVar17._12_4_ = fVar5 + 1.0;
        auVar31 = vfmadd231ps_fma(auVar17,auVar38,auVar31);
        auVar32._0_4_ = (int)auVar33._0_4_;
        auVar32._4_4_ = (int)auVar33._4_4_;
        auVar32._8_4_ = (int)auVar33._8_4_;
        auVar32._12_4_ = (int)auVar33._12_4_;
        auVar39._8_4_ = 0x3f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar33 = vpslld_avx(auVar32,0x17);
        auVar33 = vpaddd_avx(auVar33,auVar39);
        auVar31 = vfmadd213ps_fma(auVar33,auVar31,auVar42);
        auVar33 = vrcpps_avx(auVar31);
        auVar31 = vfmsub213ps_fma(auVar31,auVar33,auVar42);
        auVar33 = vfnmadd132ps_fma(auVar31,auVar33,auVar33);
        *(undefined1 (*) [16])*pauVar15 = auVar33;
        pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
        uVar10 = uVar12 + 7;
        uVar12 = uVar12 + 4;
      }
      auVar20 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar35 = ZEXT1632(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
      if ((int)uVar12 < (int)uVar13) {
        uVar12 = ~uVar12 + uVar13;
        auVar22._8_4_ = uVar12;
        auVar22._0_8_ = CONCAT44(0,uVar12);
        auVar22._12_4_ = 0;
        auVar22._16_4_ = uVar12;
        auVar22._20_4_ = 0;
        auVar22._24_4_ = uVar12;
        auVar22._28_4_ = 0;
        uVar16 = 0;
        do {
          auVar23._8_8_ = uVar16;
          auVar23._0_8_ = uVar16;
          auVar23._16_8_ = uVar16;
          auVar23._24_8_ = uVar16;
          auVar58 = vpor_avx2(auVar23,_DAT_0031a300);
          auVar40._8_8_ = 0x8000000000000000;
          auVar40._0_8_ = 0x8000000000000000;
          auVar40._16_8_ = 0x8000000000000000;
          auVar40._24_8_ = 0x8000000000000000;
          auVar20 = vpor_avx2(auVar23,auVar20);
          auVar24 = vpor_avx2(auVar40,auVar22);
          auVar20 = vpcmpgtq_avx2(auVar20 ^ auVar40,auVar24);
          auVar58 = vpcmpgtq_avx2(auVar58 ^ auVar40,auVar24);
          auVar20 = vpackssdw_avx2(auVar58,auVar20);
          auVar51 = vpackssdw_avx(SUB3216(auVar20 ^ auVar35,0),SUB3216(auVar20 ^ auVar35,0x10));
          auVar51 = vpshufd_avx(auVar51,0xd8);
          auVar20 = vpmovzxwd_avx2(auVar51);
          auVar24 = vpslld_avx2(auVar20,0x1f);
          auVar20 = vmaskmovps_avx(auVar24,*(undefined1 (*) [32])((long)*pauVar15 + uVar16 * 4));
          auVar18._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
          auVar18._8_4_ = auVar20._8_4_ ^ 0x80000000;
          auVar18._12_4_ = auVar20._12_4_ ^ 0x80000000;
          auVar25._16_4_ = -auVar20._16_4_;
          auVar25._0_16_ = auVar18;
          auVar25._20_4_ = auVar20._20_4_ ^ 0x80000000;
          auVar25._24_4_ = auVar20._24_4_ ^ 0x80000000;
          auVar25._28_4_ = auVar20._28_4_ ^ 0x80000000;
          auVar29 = auVar25._16_16_;
          auVar42 = auVar35._0_16_;
          local_128._0_4_ = expf(auVar25._16_4_);
          local_128._4_4_ = extraout_XMM0_Db;
          local_128._8_4_ = extraout_XMM0_Dc;
          local_128._12_4_ = extraout_XMM0_Dd;
          auVar51 = vpermilps_avx(auVar29,0xf5);
          auVar41._0_4_ = expf(auVar51._0_4_);
          auVar41._4_60_ = extraout_var;
          auVar51 = vinsertps_avx(local_128,auVar41._0_16_,0x10);
          auVar57 = vpermilps_avx(auVar29,0x4e);
          auVar44._0_4_ = expf(auVar57._0_4_);
          auVar44._4_60_ = extraout_var_00;
          auVar51 = vinsertps_avx(auVar51,auVar44._0_16_,0x20);
          auVar57 = vpermilps_avx(auVar29,0xff);
          auVar55._0_4_ = expf(auVar57._0_4_);
          auVar55._4_60_ = extraout_var_01;
          auVar51 = vinsertps_avx(auVar51,auVar55._0_16_,0x30);
          local_e8 = (float)auVar18._0_8_;
          auVar35 = ZEXT1632(auVar42);
          local_128._0_4_ = expf(local_e8);
          local_128._4_4_ = extraout_XMM0_Db_00;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          auVar57 = vpermilps_avx(auVar18,0xf5);
          auVar79._0_4_ = expf(auVar57._0_4_);
          auVar79._4_60_ = extraout_var_02;
          auVar57 = vinsertps_avx(local_128,auVar79._0_16_,0x10);
          auVar29 = vpermilps_avx(auVar18,0x4e);
          auVar27._0_4_ = expf(auVar29._0_4_);
          auVar27._4_60_ = extraout_var_03;
          auVar57 = vinsertps_avx(auVar57,auVar27._0_16_,0x20);
          auVar29 = vpermilps_avx(auVar18,0xff);
          auVar28._0_4_ = expf(auVar29._0_4_);
          auVar28._4_60_ = extraout_var_04;
          auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
          auVar20 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar64._8_4_ = 0x3f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar64._12_4_ = 0x3f800000;
          auVar64._16_4_ = 0x3f800000;
          auVar64._20_4_ = 0x3f800000;
          auVar64._24_4_ = 0x3f800000;
          auVar64._28_4_ = 0x3f800000;
          auVar41 = ZEXT3264(auVar64);
          auVar57 = vinsertps_avx(auVar57,auVar28._0_16_,0x30);
          auVar26._0_4_ = auVar57._0_4_ + 1.0;
          auVar26._4_4_ = auVar57._4_4_ + 1.0;
          auVar26._8_4_ = auVar57._8_4_ + 1.0;
          auVar26._12_4_ = auVar57._12_4_ + 1.0;
          auVar26._16_4_ = auVar51._0_4_ + 1.0;
          auVar26._20_4_ = auVar51._4_4_ + 1.0;
          auVar26._24_4_ = auVar51._8_4_ + 1.0;
          auVar26._28_4_ = auVar51._12_4_ + 1.0;
          auVar58 = vrcpps_avx(auVar26);
          auVar51 = vfmsub213ps_fma(auVar26,auVar58,auVar64);
          auVar51 = vfnmadd132ps_fma(ZEXT1632(auVar51),auVar58,auVar58);
          auVar58 = vmaskmovps_avx(auVar24,ZEXT1632(auVar51));
          *(undefined1 (*) [32])((long)*pauVar15 + uVar16 * 4) = auVar58;
          uVar16 = uVar16 + 8;
        } while ((CONCAT44(0,uVar12) + 8 & 0xfffffffffffffff8) != uVar16);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar14);
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}